

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::DisjunctionPass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  code *pcVar1;
  bool bVar2;
  Node *pNVar3;
  undefined4 *puVar4;
  Node *curr;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  
  pNVar3 = AlternativePass1(this);
  pNVar6 = pNVar3;
  if (pNVar3->tag == Alt) {
    do {
      pNVar5 = pNVar6;
      pNVar6 = *(Node **)&pNVar5[1].tag;
    } while (*(Node **)&pNVar5[1].tag != (Node *)0x0);
  }
  else {
    pNVar5 = (Node *)0x0;
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    pNVar7 = pNVar5;
    pNVar6 = pNVar3;
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) {
LAB_00ed762b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (*this->next != '|') {
      return pNVar6;
    }
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00ed762b;
      *puVar4 = 0;
    }
    if ((char)*this->next < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar2) goto LAB_00ed762b;
      *puVar4 = 0;
    }
    this->next = this->next + 1;
    curr = AlternativePass1(this);
    if (curr == (Node *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x2ea,"(next != nullptr)","next != nullptr");
      if (!bVar2) goto LAB_00ed762b;
      *puVar4 = 0;
    }
    pNVar3 = pNVar6;
    if (pNVar7 != (Node *)0x0) {
      pNVar3 = (Node *)pNVar7[1]._vptr_Node;
    }
    pNVar3 = UnionNodes(this,pNVar3,curr);
    if (pNVar3 == (Node *)0x0) {
      if (curr->tag == Alt) {
        if (curr == (Node *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x2f9,"(nextList != nullptr)","nextList != nullptr");
          if (!bVar2) goto LAB_00ed762b;
          *puVar4 = 0;
        }
        pNVar3 = pNVar6;
        if (pNVar7 != (Node *)0x0) {
          pNVar3 = (Node *)pNVar7[1]._vptr_Node;
        }
        pNVar3 = UnionNodes(this,pNVar3,(Node *)curr[1]._vptr_Node);
        if (pNVar3 != (Node *)0x0) {
          if (pNVar7 != (Node *)0x0) {
            pNVar7[1]._vptr_Node = (_func_int **)pNVar3;
            pNVar3 = pNVar6;
          }
          curr = *(Node **)&curr[1].tag;
          pNVar6 = pNVar3;
        }
        if (pNVar7 == (Node *)0x0) {
          pNVar3 = (Node *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
          pNVar3->tag = Alt;
          pNVar3->features = 0;
          *(uint *)&pNVar3->field_0xc = *(uint *)&pNVar3->field_0xc & 0xffff8000;
          pNVar3->firstSet = (CharSet<char16_t> *)0x0;
          pNVar3->followSet = (CharSet<char16_t> *)0x0;
          (pNVar3->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar3->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar3->thisConsumes).upper = 0xffffffff;
          (pNVar3->followConsumes).upper = 0xffffffff;
          pNVar3->_vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
          pNVar3[1]._vptr_Node = (_func_int **)pNVar6;
          *(Node **)&pNVar3[1].tag = curr;
          pNVar3[1].firstSet = (CharSet<char16_t> *)0x0;
          *(undefined4 *)&pNVar3[1].followSet = 0;
          *(undefined1 *)((long)&pNVar3[1].followSet + 4) = 0;
          pNVar3[1].prevConsumes.lower = 0;
        }
        else {
          *(Node **)&pNVar7[1].tag = curr;
          pNVar3 = pNVar6;
        }
        if (curr == (Node *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x309,"(nextList != nullptr)","nextList != nullptr");
          if (!bVar2) goto LAB_00ed762b;
          *puVar4 = 0;
        }
        do {
          pNVar6 = curr + 1;
          pNVar5 = curr;
          curr = *(Node **)&pNVar6->tag;
        } while (*(Node **)&pNVar6->tag != (Node *)0x0);
      }
      else {
        pNVar5 = (Node *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
        *(uint *)&pNVar5->field_0xc = *(uint *)&pNVar5->field_0xc & 0xffff8000;
        pNVar5->tag = Alt;
        pNVar5->features = 0;
        pNVar5->firstSet = (CharSet<char16_t> *)0x0;
        pNVar5->followSet = (CharSet<char16_t> *)0x0;
        (pNVar5->prevConsumes).lower = 0;
        *(undefined8 *)&(pNVar5->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar5->thisConsumes).upper = 0xffffffff;
        (pNVar5->followConsumes).upper = 0xffffffff;
        pNVar5->_vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
        pNVar5[1]._vptr_Node = (_func_int **)curr;
        pNVar5[1].prevConsumes.lower = 0;
        pNVar5[1].tag = Empty;
        pNVar5[1].features = 0;
        *(undefined4 *)&pNVar5[1].field_0xc = 0;
        pNVar5[1].firstSet = (CharSet<char16_t> *)0x0;
        *(undefined8 *)((long)&pNVar5[1].firstSet + 5) = 0;
        if (pNVar7 == (Node *)0x0) {
          pNVar3 = (Node *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
          pNVar3->tag = Alt;
          pNVar3->features = 0;
          *(uint *)&pNVar3->field_0xc = *(uint *)&pNVar3->field_0xc & 0xffff8000;
          pNVar3->firstSet = (CharSet<char16_t> *)0x0;
          pNVar3->followSet = (CharSet<char16_t> *)0x0;
          (pNVar3->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar3->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar3->thisConsumes).upper = 0xffffffff;
          (pNVar3->followConsumes).upper = 0xffffffff;
          pNVar3->_vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
          pNVar3[1]._vptr_Node = (_func_int **)pNVar6;
          *(Node **)&pNVar3[1].tag = pNVar5;
          pNVar3[1].firstSet = (CharSet<char16_t> *)0x0;
          *(undefined4 *)&pNVar3[1].followSet = 0;
          *(undefined1 *)((long)&pNVar3[1].followSet + 4) = 0;
          pNVar3[1].prevConsumes.lower = 0;
        }
        else {
          *(Node **)&pNVar7[1].tag = pNVar5;
          pNVar3 = pNVar6;
        }
      }
    }
    else {
      pNVar5 = (Node *)0x0;
      if (pNVar7 != (Node *)0x0) {
        pNVar7[1]._vptr_Node = (_func_int **)pNVar3;
        pNVar3 = pNVar6;
        pNVar5 = pNVar7;
      }
    }
  } while( true );
}

Assistant:

Node* Parser<P, IsLiteral>::DisjunctionPass1()
    {
        // Maintain the invariants:
        //  - alt lists have two or more items
        //  - alt list items are never alt lists (so we must inline them)
        //  - an alt list never contains two consecutive match-character/match-set nodes
        //    (so we must union consecutive items into a single set)
        Node* node = AlternativePass1();
        AltNode* last = 0;
        // First node may be an alternative
        if (node->tag == Node::Alt)
        {
            last = (AltNode*)node;
            while (last->tail != 0)
                last = last->tail;
        }
        while (true)
        {
            // Could be terminating 0
            if (ECLookahead() != '|')
                return node;
            ECConsume(); // '|'
            Node* next = AlternativePass1();
            AnalysisAssert(next != nullptr);
            Node* revisedPrev = UnionNodes(last == 0 ? node : last->head, next);
            if (revisedPrev != 0)
            {
                // Can merge next into previously seen alternative
                if (last == 0)
                    node = revisedPrev;
                else
                    last->head = revisedPrev;
            }
            else if (next->tag == Node::Alt)
            {
                AltNode* nextList = (AltNode*)next;
                // Since we just had to dereference next to get here, we know that nextList
                // can't be nullptr in this case.
                AnalysisAssert(nextList != nullptr);
                // Append inner list to current list
                revisedPrev = UnionNodes(last == 0 ? node : last->head, nextList->head);
                if (revisedPrev != 0)
                {
                    // Can merge head of list into previously seen alternative
                    if (last ==0)
                        node = revisedPrev;
                    else
                        last->head = revisedPrev;
                    nextList = nextList->tail;
                }
                if (last == 0)
                    node = Anew(ctAllocator, AltNode, node, nextList);
                else
                    last->tail = nextList;
                AnalysisAssert(nextList != nullptr);
                while (nextList->tail != 0)
                    nextList = nextList->tail;
                last = nextList;
            }
            else
            {
                // Append node
                AltNode* cons = Anew(ctAllocator, AltNode, next, 0);
                if (last == 0)
                    node = Anew(ctAllocator, AltNode, node, cons);
                else
                    last->tail = cons;
                last = cons;
            }
        }
    }